

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O0

void __thiscall AActor::LinkToWorld(AActor *this,bool spawningmapthing,sector_t *sector)

{
  FBlockNode **ppFVar1;
  AActor *pAVar2;
  FBlockNode *pFVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  DWORD DVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int b;
  subsector_t *psVar11;
  AActor **ppAVar12;
  FBlockNode *pFVar13;
  double y_00;
  double dVar14;
  bool local_141;
  FBlockNode *node;
  FBlockNode **link_1;
  int x;
  int y;
  int y2;
  int y1;
  int x2;
  int x1;
  DVector3 pos;
  FBlockNode **ppFStack_f0;
  int i;
  FBlockNode **alink;
  DVector3 local_d8;
  undefined1 local_c0 [8];
  FPortalGroupArray check;
  AActor *next;
  AActor **link;
  DVector3 local_78;
  TVector2<double> local_60;
  DVector3 local_50;
  TVector2<double> local_38;
  TFlags<ActorFlag4,_unsigned_int> local_28;
  byte local_21;
  sector_t *psStack_20;
  bool spawning;
  sector_t *sector_local;
  AActor *pAStack_10;
  bool spawningmapthing_local;
  AActor *this_local;
  
  iVar8 = (int)this;
  local_21 = spawningmapthing;
  psStack_20 = sector;
  sector_local._7_1_ = spawningmapthing;
  pAStack_10 = this;
  if (spawningmapthing) {
    TFlags<ActorFlag4,_unsigned_int>::operator&
              (&local_28,iVar8 + (MF4_STRIFEDAMAGE|MF4_ACTLIKEBRIDGE|MF4_RANDOMIZE|MF4_BOSSDEATH));
    uVar5 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_28);
    local_141 = uVar5 != 0 && psStack_20 == (sector_t *)0x0;
    if ((local_141) && (bVar4 = FixMapthingPos(this), bVar4)) {
      local_21 = 0;
    }
  }
  if (psStack_20 == (sector_t *)0x0) {
    if (((local_21 & 1) == 0) || (numgamenodes == 0)) {
      Pos(&local_50,this);
      TVector2<double>::TVector2(&local_38,&local_50);
      psStack_20 = P_PointInSector(&local_38);
    }
    else {
      dVar14 = X(this);
      y_00 = Y(this);
      psStack_20 = P_PointInSectorBuggy(dVar14,y_00);
    }
  }
  this->Sector = psStack_20;
  Pos(&local_78,this);
  TVector2<double>::TVector2(&local_60,&local_78);
  psVar11 = R_PointInSubsector(&local_60);
  this->subsector = psVar11;
  TFlags<ActorFlag,_unsigned_int>::operator&
            ((TFlags<ActorFlag,_unsigned_int> *)((long)&link + 4),
             iVar8 + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_NOSECTOR|MF_SHOOTABLE));
  uVar5 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)((long)&link + 4));
  if (uVar5 == 0) {
    ppAVar12 = &psStack_20->thinglist;
    pAVar2 = *ppAVar12;
    this->snext = pAVar2;
    if (pAVar2 != (AActor *)0x0) {
      pAVar2->sprev = &this->snext;
    }
    this->sprev = ppAVar12;
    *ppAVar12 = this;
    P_CreateSecNodeList(this);
    this->touching_sectorlist = sector_list;
    sector_list = (msecnode_t *)0x0;
  }
  TFlags<ActorFlag,_unsigned_int>::operator&
            ((TFlags<ActorFlag,_unsigned_int> *)&check.data.Count,
             iVar8 + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_NOSECTOR|MF_SHOOTABLE));
  uVar5 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&check.data.Count);
  if (uVar5 == 0) {
    FPortalGroupArray::FPortalGroupArray((FPortalGroupArray *)local_c0,1);
    iVar8 = this->Sector->PortalGroup;
    Pos(&local_d8,this);
    dVar14 = Top(this);
    P_CollectConnectedGroups(iVar8,&local_d8,dVar14,this->radius,(FPortalGroupArray *)local_c0);
    this->BlockNode = (FBlockNode *)0x0;
    ppFStack_f0 = &this->BlockNode;
    for (pos.Z._4_4_ = 0xffffffff; uVar5 = pos.Z._4_4_,
        uVar6 = FPortalGroupArray::Size((FPortalGroupArray *)local_c0), (int)uVar5 < (int)uVar6;
        pos.Z._4_4_ = pos.Z._4_4_ + 1) {
      if (pos.Z._4_4_ == 0xffffffff) {
        Pos((DVector3 *)&x2,this);
      }
      else {
        DVar7 = FPortalGroupArray::operator[]((FPortalGroupArray *)local_c0,pos.Z._4_4_);
        PosRelative((DVector3 *)&x2,this,DVar7 & 0xffff3fff);
      }
      iVar8 = GetBlockX(_x2 - this->radius);
      iVar9 = GetBlockX(_x2 + this->radius);
      iVar10 = GetBlockY(pos.X - this->radius);
      b = GetBlockY(pos.X + this->radius);
      if ((((iVar8 < bmapwidth) && (-1 < iVar9)) && (iVar10 < bmapheight)) && (-1 < b)) {
        iVar8 = MAX<int>(0,iVar8);
        link_1._4_4_ = MAX<int>(0,iVar10);
        iVar9 = MIN<int>(bmapwidth + -1,iVar9);
        iVar10 = MIN<int>(bmapheight + -1,b);
        for (; link_1._0_4_ = iVar8, link_1._4_4_ <= iVar10; link_1._4_4_ = link_1._4_4_ + 1) {
          for (; (int)link_1 <= iVar9; link_1._0_4_ = (int)link_1 + 1) {
            ppFVar1 = blocklinks + (link_1._4_4_ * bmapwidth + (int)link_1);
            pFVar13 = FBlockNode::Create(this,(int)link_1,link_1._4_4_,this->Sector->PortalGroup);
            pFVar3 = *ppFVar1;
            pFVar13->NextActor = pFVar3;
            if (pFVar3 != (FBlockNode *)0x0) {
              (*ppFVar1)->PrevActor = &pFVar13->NextActor;
            }
            pFVar13->PrevActor = ppFVar1;
            *ppFVar1 = pFVar13;
            pFVar13->PrevBlock = ppFStack_f0;
            pFVar13->NextBlock = (FBlockNode *)0x0;
            *ppFStack_f0 = pFVar13;
            ppFStack_f0 = &pFVar13->NextBlock;
          }
        }
      }
    }
    FPortalGroupArray::~FPortalGroupArray((FPortalGroupArray *)local_c0);
  }
  if ((sector_local._7_1_ & 1) == 0) {
    UpdateRenderSectorList(this);
  }
  return;
}

Assistant:

void AActor::LinkToWorld(bool spawningmapthing, sector_t *sector)
{
	bool spawning = spawningmapthing;

	if (spawning)
	{
		if ((flags4 & MF4_FIXMAPTHINGPOS) && sector == NULL)
		{
			if (FixMapthingPos()) spawning = false;
		}
	}

	if (sector == NULL)
	{
		if (!spawning || numgamenodes == 0)
		{
			sector = P_PointInSector(Pos());
		}
		else
		{
			sector = P_PointInSectorBuggy(X(), Y());
		}
	}

	Sector = sector;
	subsector = R_PointInSubsector(Pos());	// this is from the rendering nodes, not the gameplay nodes!

	if (!(flags & MF_NOSECTOR))
	{
		// invisible things don't go into the sector links
		// killough 8/11/98: simpler scheme using pointer-to-pointer prev
		// pointers, allows head nodes to be treated like everything else

		AActor **link = &sector->thinglist;
		AActor *next = *link;
		if ((snext = next))
			next->sprev = &snext;
		sprev = link;
		*link = this;

		// phares 3/16/98
		//
		// If sector_list isn't NULL, it has a collection of sector
		// nodes that were just removed from this Thing.

		// Collect the sectors the object will live in by looking at
		// the existing sector_list and adding new nodes and deleting
		// obsolete ones.

		// When a node is deleted, its sector links (the links starting
		// at sector_t->touching_thinglist) are broken. When a node is
		// added, new sector links are created.
		P_CreateSecNodeList(this);
		touching_sectorlist = sector_list;	// Attach to thing
		sector_list = NULL;		// clear for next time
	}


	// link into blockmap (inert things don't need to be in the blockmap)
	if (!(flags & MF_NOBLOCKMAP))
	{
		FPortalGroupArray check;

		P_CollectConnectedGroups(Sector->PortalGroup, Pos(), Top(), radius, check);

		BlockNode = NULL;
		FBlockNode **alink = &this->BlockNode;
		for (int i = -1; i < (int)check.Size(); i++)
		{
			DVector3 pos = i==-1? Pos() : PosRelative(check[i] & ~FPortalGroupArray::FLAT);

			int x1 = GetBlockX(pos.X - radius);
			int x2 = GetBlockX(pos.X + radius);
			int y1 = GetBlockY(pos.Y - radius);
			int y2 = GetBlockY(pos.Y + radius);

			if (x1 >= bmapwidth || x2 < 0 || y1 >= bmapheight || y2 < 0)
			{ // thing is off the map
			}
			else
			{ // [RH] Link into every block this actor touches, not just the center one
				x1 = MAX(0, x1);
				y1 = MAX(0, y1);
				x2 = MIN(bmapwidth - 1, x2);
				y2 = MIN(bmapheight - 1, y2);
				for (int y = y1; y <= y2; ++y)
				{
					for (int x = x1; x <= x2; ++x)
					{
						FBlockNode **link = &blocklinks[y*bmapwidth + x];
						FBlockNode *node = FBlockNode::Create(this, x, y, this->Sector->PortalGroup);

						// Link in to block
						if ((node->NextActor = *link) != NULL)
						{
							(*link)->PrevActor = &node->NextActor;
						}
						node->PrevActor = link;
						*link = node;

						// Link in to actor
						node->PrevBlock = alink;
						node->NextBlock = NULL;
						(*alink) = node;
						alink = &node->NextBlock;
					}
				}
			}
		}
	}
	// Portal links cannot be done unless the level is fully initialized.
	if (!spawningmapthing) UpdateRenderSectorList();
}